

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,string *message)

{
  string local_48;
  string *local_28;
  string *message_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  ScopedTrace *this_local;
  
  local_28 = message;
  message_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)this;
  std::__cxx11::string::string((string *)&local_48,message);
  PushTrace(this,file,line,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const std::string& message) {
    PushTrace(file, line, message);
  }